

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

void pstack::
     print_container<std::vector<pstack::Dwarf::LineState,std::allocator<pstack::Dwarf::LineState>>,char_const&>
               (ostream *os,
               vector<pstack::Dwarf::LineState,_std::allocator<pstack::Dwarf::LineState>_>
               *container,char *ctx)

{
  bool bVar1;
  ostream *os_00;
  JSON<pstack::Dwarf::LineState,_char> local_60;
  LineState *local_50;
  LineState *field;
  const_iterator __end0;
  const_iterator __begin0;
  vector<pstack::Dwarf::LineState,_std::allocator<pstack::Dwarf::LineState>_> *__range2;
  char *sep;
  char *ctx_local;
  vector<pstack::Dwarf::LineState,_std::allocator<pstack::Dwarf::LineState>_> *container_local;
  ostream *os_local;
  
  std::operator<<(os,"[ ");
  __range2 = (vector<pstack::Dwarf::LineState,_std::allocator<pstack::Dwarf::LineState>_> *)0x2a9a45
  ;
  __end0 = std::vector<pstack::Dwarf::LineState,_std::allocator<pstack::Dwarf::LineState>_>::begin
                     (container);
  field = (LineState *)
          std::vector<pstack::Dwarf::LineState,_std::allocator<pstack::Dwarf::LineState>_>::end
                    (container);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_pstack::Dwarf::LineState_*,_std::vector<pstack::Dwarf::LineState,_std::allocator<pstack::Dwarf::LineState>_>_>
                      (&__end0,(__normal_iterator<const_pstack::Dwarf::LineState_*,_std::vector<pstack::Dwarf::LineState,_std::allocator<pstack::Dwarf::LineState>_>_>
                                *)&field);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_50 = __gnu_cxx::
               __normal_iterator<const_pstack::Dwarf::LineState_*,_std::vector<pstack::Dwarf::LineState,_std::allocator<pstack::Dwarf::LineState>_>_>
               ::operator*(&__end0);
    os_00 = std::operator<<(os,(char *)__range2);
    local_60 = json<pstack::Dwarf::LineState,char>(local_50,ctx);
    operator<<(os_00,&local_60);
    __range2 = (vector<pstack::Dwarf::LineState,_std::allocator<pstack::Dwarf::LineState>_> *)
               anon_var_dwarf_c456f;
    __gnu_cxx::
    __normal_iterator<const_pstack::Dwarf::LineState_*,_std::vector<pstack::Dwarf::LineState,_std::allocator<pstack::Dwarf::LineState>_>_>
    ::operator++(&__end0);
  }
  std::operator<<(os," ]");
  return;
}

Assistant:

void print_container(std::ostream &os, const Container &container, Context &&ctx, std::false_type)
{
   os << "[ ";
   const char *sep = "";
   for (const auto &field : container) {
      os << sep << json(field, ctx);
      sep = ",\n";
   }
   os << " ]";
}